

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall LogicalOperationNode::Evaluate(LogicalOperationNode *this,Date *date,string *event)

{
  LogicalOperation LVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  
  LVar1 = this->op;
  iVar4 = (**((this->leftOperand).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_Node)();
  if (LVar1 == Or) {
    bVar3 = true;
    if ((char)iVar4 == '\0') goto LAB_0010f227;
  }
  else {
    if ((char)iVar4 != '\0') {
LAB_0010f227:
      peVar2 = (this->rightOperand).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar4 = (**peVar2->_vptr_Node)(peVar2,date,event);
      return SUB41(iVar4,0);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool LogicalOperationNode::Evaluate(const Date& date, const string& event) const {
    if (op == LogicalOperation::Or) {
        return leftOperand->Evaluate(date, event) || rightOperand->Evaluate(date, event);
    } else {
        return leftOperand->Evaluate(date, event) && rightOperand->Evaluate(date, event);
    }
}